

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

void __thiscall
opengv::math::Bracket::divide
          (Bracket *this,
          list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *brackets)

{
  double lowerBound;
  double upperBound;
  Bracket *pBVar1;
  Ptr upperBracket;
  Ptr lowerBracket;
  
  lowerBound = this->_lowerBound;
  upperBound = (lowerBound + this->_upperBound) * 0.5;
  pBVar1 = (Bracket *)operator_new(0x30);
  Bracket(pBVar1,lowerBound,upperBound,this->_lowerBoundChanges,false);
  std::__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<opengv::math::Bracket,void>
            ((__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2> *)&lowerBracket,pBVar1)
  ;
  pBVar1 = (Bracket *)operator_new(0x30);
  Bracket(pBVar1,upperBound,this->_upperBound,this->_upperBoundChanges,true);
  std::__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<opengv::math::Bracket,void>
            ((__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2> *)&upperBracket,pBVar1)
  ;
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back(brackets,&lowerBracket);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back(brackets,&upperBracket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&upperBracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lowerBracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
opengv::math::Bracket::divide( std::list<Ptr> & brackets ) const
{
  double center = (_upperBound + _lowerBound) / 2.0;
  Ptr lowerBracket(new Bracket(_lowerBound,center,_lowerBoundChanges,false));
  Ptr upperBracket(new Bracket(center,_upperBound,_upperBoundChanges,true));
  brackets.push_back(lowerBracket);
  brackets.push_back(upperBracket);
}